

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

void lddmc_nodecount_levels_mark(MDD mdd,size_t *variables)

{
  uint8_t *puVar1;
  long lVar2;
  
  if (1 < mdd) {
    do {
      lVar2 = mdd * 0x10;
      puVar1 = nodes->data;
      if ((*(ulong *)(puVar1 + lVar2) & 1) != 0) {
        return;
      }
      *(ulong *)(puVar1 + lVar2) = *(ulong *)(puVar1 + lVar2) | 1;
      *variables = *variables + 1;
      lddmc_nodecount_levels_mark(*(ulong *)(puVar1 + lVar2) >> 1 & 0x7fffffffffff,variables);
      variables = variables + 1;
      mdd = *(ulong *)(puVar1 + lVar2 + 8) >> 0x11;
    } while (0x3ffff < *(ulong *)(puVar1 + lVar2 + 8));
  }
  return;
}

Assistant:

static void
lddmc_nodecount_levels_mark(MDD mdd, size_t *variables)
{
    if (mdd <= lddmc_true) return;
    mddnode_t n = LDD_GETNODE(mdd);
    if (!mddnode_getmark(n)) {
        mddnode_setmark(n, 1);
        (*variables) += 1;
        lddmc_nodecount_levels_mark(mddnode_getright(n), variables);
        lddmc_nodecount_levels_mark(mddnode_getdown(n), variables+1);
    }
}